

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O1

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::InitCovering(S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  uint64 uVar1;
  int iVar2;
  S2CellId SVar3;
  S2CellId SVar4;
  ulong uVar5;
  Iterator next;
  Iterator last;
  Iterator cell_first;
  Iterator cell_last;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> local_50;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> local_48;
  S2CellId local_40;
  _Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false> local_38;
  
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve(&this->index_covering_,6);
  (*this->index_->_vptr_S2ShapeIndex[6])(&local_50,this->index_,0);
  (*this->index_->_vptr_S2ShapeIndex[6])(&local_48,this->index_,1);
  (*(local_48._M_head_impl)->_vptr_IteratorBase[5])();
  uVar1 = ((local_50._M_head_impl)->id_).id_;
  SVar4.id_ = ((local_48._M_head_impl)->id_).id_;
  if (uVar1 != SVar4.id_) {
    local_40.id_ = uVar1;
    iVar2 = S2CellId::GetCommonAncestorLevel(&local_40,SVar4);
    local_40.id_ = ((local_48._M_head_impl)->id_).id_;
    SVar3 = S2CellId::parent(&local_40,iVar2 + 1);
    local_40.id_ = ((local_50._M_head_impl)->id_).id_;
    SVar4 = S2CellId::parent(&local_40,iVar2 + 1);
    if (SVar4.id_ != SVar3.id_) {
      do {
        uVar5 = SVar4.id_ - 1 | SVar4.id_;
        if (((local_50._M_head_impl)->id_).id_ <= uVar5) {
          (*(local_50._M_head_impl)->_vptr_IteratorBase[10])(&local_40);
          (*(local_50._M_head_impl)->_vptr_IteratorBase[6])
                    (local_50._M_head_impl,(-uVar5 & uVar5) * 2 + uVar5);
          (*(local_50._M_head_impl)->_vptr_IteratorBase[10])(&local_38);
          (*(local_38._M_head_impl)->_vptr_IteratorBase[5])();
          AddInitialRange(this,(Iterator *)&local_40,(Iterator *)&local_38);
          if (local_38._M_head_impl != (IteratorBase *)0x0) {
            (*(local_38._M_head_impl)->_vptr_IteratorBase[1])();
          }
          if ((long *)local_40.id_ != (long *)0x0) {
            (**(code **)(*(long *)local_40.id_ + 8))();
          }
        }
        SVar4.id_ = SVar4.id_ + (-SVar4.id_ & SVar4.id_) * 2;
      } while (SVar4.id_ != SVar3.id_);
    }
  }
  AddInitialRange(this,(Iterator *)&local_50,(Iterator *)&local_48);
  if (local_48._M_head_impl != (IteratorBase *)0x0) {
    (*(local_48._M_head_impl)->_vptr_IteratorBase[1])();
  }
  if (local_50._M_head_impl != (IteratorBase *)0x0) {
    (*(local_50._M_head_impl)->_vptr_IteratorBase[1])();
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::InitCovering() {
  // Find the range of S2Cells spanned by the index and choose a level such
  // that the entire index can be covered with just a few cells.  These are
  // the "top-level" cells.  There are two cases:
  //
  //  - If the index spans more than one face, then there is one top-level cell
  // per spanned face, just big enough to cover the index cells on that face.
  //
  //  - If the index spans only one face, then we find the smallest cell "C"
  // that covers the index cells on that face (just like the case above).
  // Then for each of the 4 children of "C", if the child contains any index
  // cells then we create a top-level cell that is big enough to just fit
  // those index cells (i.e., shrinking the child as much as possible to fit
  // its contents).  This essentially replicates what would happen if we
  // started with "C" as the top-level cell, since "C" would immediately be
  // split, except that we take the time to prune the children further since
  // this will save work on every subsequent query.

  // Don't need to reserve index_cells_ since it is an InlinedVector.
  index_covering_.reserve(6);

  // TODO(ericv): Use a single iterator (iter_) below and save position
  // information using pair<S2CellId, const S2ShapeIndexCell*> type.
  S2ShapeIndex::Iterator next(index_, S2ShapeIndex::BEGIN);
  S2ShapeIndex::Iterator last(index_, S2ShapeIndex::END);
  last.Prev();
  if (next.id() != last.id()) {
    // The index has at least two cells.  Choose a level such that the entire
    // index can be spanned with at most 6 cells (if the index spans multiple
    // faces) or 4 cells (it the index spans a single face).
    int level = next.id().GetCommonAncestorLevel(last.id()) + 1;

    // Visit each potential top-level cell except the last (handled below).
    S2CellId last_id = last.id().parent(level);
    for (S2CellId id = next.id().parent(level); id != last_id; id = id.next()) {
      // Skip any top-level cells that don't contain any index cells.
      if (id.range_max() < next.id()) continue;

      // Find the range of index cells contained by this top-level cell and
      // then shrink the cell if necessary so that it just covers them.
      S2ShapeIndex::Iterator cell_first = next;
      next.Seek(id.range_max().next());
      S2ShapeIndex::Iterator cell_last = next;
      cell_last.Prev();
      AddInitialRange(cell_first, cell_last);
    }
  }
  AddInitialRange(next, last);
}